

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

void __thiscall
tcu::CompressedTexture::setStorage
          (CompressedTexture *this,CompressedTexFormat format,int width,int height,int depth)

{
  int iVar1;
  IVec3 blockPixelSize;
  int local_3c;
  int local_38;
  int local_34;
  
  this->m_format = format;
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  if (format == COMPRESSEDTEXFORMAT_LAST) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,0);
    return;
  }
  getBlockPixelSize((tcu *)&local_3c,format);
  iVar1 = getBlockSize(format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,
             (long)(int)(((depth / local_34 + 1) - (uint)(depth % local_34 == 0)) *
                         ((height / local_38 + 1) - (uint)(height % local_38 == 0)) *
                        ((width / local_3c + 1) - (uint)(width % local_3c == 0)) * iVar1));
  return;
}

Assistant:

void CompressedTexture::setStorage (CompressedTexFormat format, int width, int height, int depth)
{
	m_format	= format;
	m_width		= width;
	m_height	= height;
	m_depth		= depth;

	if (m_format != COMPRESSEDTEXFORMAT_LAST)
	{
		const IVec3	blockPixelSize	= getBlockPixelSize(m_format);
		const int	blockSize		= getBlockSize(m_format);

		m_data.resize(deDivRoundUp32(m_width, blockPixelSize.x()) * deDivRoundUp32(m_height, blockPixelSize.y()) * deDivRoundUp32(m_depth, blockPixelSize.z()) * blockSize);
	}
	else
	{
		DE_ASSERT(m_format == COMPRESSEDTEXFORMAT_LAST);
		DE_ASSERT(m_width == 0 && m_height == 0 && m_depth == 0);
		m_data.resize(0);
	}
}